

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::PopDebuggerScope(ByteCodeWriter *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebuggerScope *pDVar4;
  
  pDVar4 = this->m_currentDebuggerScope;
  if (pDVar4 == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xbf9,"(m_currentDebuggerScope)","m_currentDebuggerScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pDVar4 = this->m_currentDebuggerScope;
  }
  if (DAT_015bc46a == '\x01') {
    Output::Trace(DebuggerPhase,L"PopDebuggerScope() - Popped scope 0x%p of type %d.\n",pDVar4,
                  (ulong)pDVar4->scopeType);
    pDVar4 = this->m_currentDebuggerScope;
  }
  if (pDVar4 != (DebuggerScope *)0x0) {
    this->m_currentDebuggerScope = (pDVar4->parentScope).ptr;
  }
  return;
}

Assistant:

void ByteCodeWriter::PopDebuggerScope()
    {
        Assert(m_currentDebuggerScope);

        OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("PopDebuggerScope() - Popped scope 0x%p of type %d.\n"), m_currentDebuggerScope, m_currentDebuggerScope->scopeType);
        if (m_currentDebuggerScope != nullptr)
        {
            m_currentDebuggerScope = m_currentDebuggerScope->GetParentScope();
        }
    }